

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::TensorValue::CheckTypeAndMergeFrom
          (TensorValue *this,MessageLite *from)

{
  ulong uVar1;
  LogMessage *other;
  TensorValue_RepeatedLongInts *this_00;
  TensorValue_RepeatedBools *this_01;
  TensorValue_RepeatedStrings *this_02;
  TensorValue_RepeatedFloats *this_03;
  TensorValue_RepeatedInts *this_04;
  TensorValue_RepeatedDoubles *this_05;
  TensorValue_RepeatedBytes *this_06;
  undefined1 *puVar2;
  Arena *pAVar3;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__TensorValue_00485290) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::MILSpec::TensorValue *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((TensorValue *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/MIL.pb.cc"
               ,0x1f56);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  switch(*(undefined4 *)((long)&from[1]._internal_metadata_.ptr_ + 4)) {
  case 1:
    break;
  case 2:
    if (this->_oneof_case_[0] == 2) {
      this_04 = (this->value_).ints_;
LAB_0020b067:
      puVar2 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      clear_value(this);
      this->_oneof_case_[0] = 2;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_04 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedInts>(pAVar3)
      ;
      (this->value_).ints_ = this_04;
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 2) goto LAB_0020b067;
      puVar2 = _TensorValue_RepeatedInts_default_instance_;
    }
    TensorValue_RepeatedInts::MergeFrom(this_04,(TensorValue_RepeatedInts *)puVar2);
    goto switchD_0020aea3_default;
  case 3:
    if (this->_oneof_case_[0] == 3) {
      this_01 = (this->value_).bools_;
LAB_0020afa1:
      puVar2 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      clear_value(this);
      this->_oneof_case_[0] = 3;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_01 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBools>
                          (pAVar3);
      (this->value_).bools_ = this_01;
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 3) goto LAB_0020afa1;
      puVar2 = _TensorValue_RepeatedBools_default_instance_;
    }
    TensorValue_RepeatedBools::MergeFrom(this_01,(TensorValue_RepeatedBools *)puVar2);
    goto switchD_0020aea3_default;
  case 4:
    if (this->_oneof_case_[0] == 4) {
      this_02 = (this->value_).strings_;
LAB_0020afe3:
      puVar2 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      clear_value(this);
      this->_oneof_case_[0] = 4;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_02 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedStrings>
                          (pAVar3);
      (this->value_).strings_ = this_02;
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 4) goto LAB_0020afe3;
      puVar2 = _TensorValue_RepeatedStrings_default_instance_;
    }
    TensorValue_RepeatedStrings::MergeFrom(this_02,(TensorValue_RepeatedStrings *)puVar2);
    goto switchD_0020aea3_default;
  case 5:
    if (this->_oneof_case_[0] == 5) {
      this_00 = (this->value_).longints_;
LAB_0020af5f:
      puVar2 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      clear_value(this);
      this->_oneof_case_[0] = 5;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_00 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>
                          (pAVar3);
      (this->value_).longints_ = this_00;
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 5) goto LAB_0020af5f;
      puVar2 = _TensorValue_RepeatedLongInts_default_instance_;
    }
    TensorValue_RepeatedLongInts::MergeFrom(this_00,(TensorValue_RepeatedLongInts *)puVar2);
    goto switchD_0020aea3_default;
  case 6:
    if (this->_oneof_case_[0] == 6) {
      this_05 = (this->value_).doubles_;
LAB_0020b0a9:
      puVar2 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      clear_value(this);
      this->_oneof_case_[0] = 6;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_05 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>
                          (pAVar3);
      (this->value_).doubles_ = this_05;
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 6) goto LAB_0020b0a9;
      puVar2 = _TensorValue_RepeatedDoubles_default_instance_;
    }
    TensorValue_RepeatedDoubles::MergeFrom(this_05,(TensorValue_RepeatedDoubles *)puVar2);
    goto switchD_0020aea3_default;
  case 7:
    if (this->_oneof_case_[0] == 7) {
      this_06 = (this->value_).bytes_;
LAB_0020b0e7:
      puVar2 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      clear_value(this);
      this->_oneof_case_[0] = 7;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_06 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>
                          (pAVar3);
      (this->value_).bytes_ = this_06;
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 7) goto LAB_0020b0e7;
      puVar2 = _TensorValue_RepeatedBytes_default_instance_;
    }
    TensorValue_RepeatedBytes::MergeFrom(this_06,(TensorValue_RepeatedBytes *)puVar2);
  default:
    goto switchD_0020aea3_default;
  }
  if (this->_oneof_case_[0] == 1) {
    this_03 = (this->value_).floats_;
LAB_0020b025:
    puVar2 = (undefined1 *)from[1]._vptr_MessageLite;
  }
  else {
    clear_value(this);
    this->_oneof_case_[0] = 1;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_03 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedFloats>(pAVar3)
    ;
    (this->value_).floats_ = this_03;
    if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 1) goto LAB_0020b025;
    puVar2 = _TensorValue_RepeatedFloats_default_instance_;
  }
  TensorValue_RepeatedFloats::MergeFrom(this_03,(TensorValue_RepeatedFloats *)puVar2);
switchD_0020aea3_default:
  uVar1 = (from->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}